

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANN.cpp
# Opt level: O2

void annError(char *msg,ANNerr level)

{
  ostream *poVar1;
  
  if (level != ANNabort) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"ANN: WARNING----->");
    poVar1 = std::operator<<(poVar1,msg);
    std::operator<<(poVar1,"<-------------WARNING\n");
    return;
  }
  poVar1 = std::operator<<((ostream *)&std::cerr,"ANN: ERROR------->");
  poVar1 = std::operator<<(poVar1,msg);
  std::operator<<(poVar1,"<-------------ERROR\n");
  exit(1);
}

Assistant:

void annError(char const *msg, ANNerr level) {
    if (level == ANNabort) {
        std::cerr << "ANN: ERROR------->" << msg << "<-------------ERROR\n";
        exit(1);
    } else {
        std::cerr << "ANN: WARNING----->" << msg << "<-------------WARNING\n";
    }
}